

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TablePrinter.hpp
# Opt level: O2

TablePrinter * __thiscall trl::TablePrinter::operator<<(TablePrinter *this,int input)

{
  ostream *poVar1;
  int iVar2;
  reference pvVar3;
  uint uVar4;
  
  if (this->m_columnIndex == 0) {
    std::operator<<(this->m_outStream,"|");
  }
  poVar1 = this->m_outStream;
  uVar4 = 0x80;
  if (this->m_flushLeft != false) {
    uVar4 = 0x20;
  }
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       uVar4 | *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffff4f;
  pvVar3 = std::vector<int,_std::allocator<int>_>::at
                     (&this->m_columnWidths,(long)this->m_columnIndex);
  *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = (long)*pvVar3;
  std::ostream::operator<<((ostream *)this->m_outStream,input);
  if (this->m_columnIndex ==
      (int)((ulong)((long)(this->m_columnTitles).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_columnTitles).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1) {
    std::operator<<(this->m_outStream,"|\n");
    this->m_rowIndex = this->m_rowIndex + 1;
    iVar2 = 0;
  }
  else {
    std::operator<<(this->m_outStream,(string *)&this->m_columnSeparator);
    iVar2 = this->m_columnIndex + 1;
  }
  this->m_columnIndex = iVar2;
  return this;
}

Assistant:

TablePrinter& operator<<(T input) {

            if constexpr(std::is_floating_point<T>::value) {
                OutputDecimalNumber<T>(input);
            }
            else {

                if (m_columnIndex == 0)
                    m_outStream << "|";

                if (m_flushLeft)
                    m_outStream << std::left;
                else
                    m_outStream << std::right;

                // Leave 3 extra space: One for negative sign, one for zero, one for decimal
                m_outStream << std::setw(m_columnWidths.at(m_columnIndex));
                m_outStream << input;

                if (m_columnIndex == GetColumnCount() - 1) {
                    m_outStream << "|\n";
                    m_rowIndex    = m_rowIndex + 1;
                    m_columnIndex = 0;
                }
                else {
                    m_outStream << m_columnSeparator;
                    ++m_columnIndex;
                }
            }
            return *this;
        }